

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderName(xmlTextReaderPtr reader)

{
  xmlNsPtr ns;
  xmlChar *ret;
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    if (reader->curnode == (xmlNodePtr)0x0) {
      ret = (xmlChar *)reader->node;
    }
    else {
      ret = (xmlChar *)reader->curnode;
    }
    switch(*(undefined4 *)(ret + 8)) {
    case 1:
    case 2:
      if ((*(long *)(ret + 0x48) == 0) || (*(long *)(*(long *)(ret + 0x48) + 0x18) == 0)) {
        reader_local = (xmlTextReaderPtr)readerStrdup(reader,*(xmlChar **)(ret + 0x10));
      }
      else {
        reader_local = (xmlTextReaderPtr)
                       xmlBuildQName(*(xmlChar **)(ret + 0x10),
                                     *(xmlChar **)(*(long *)(ret + 0x48) + 0x18),(xmlChar *)0x0,0);
        if (reader_local == (xmlTextReaderPtr)0x0) {
          xmlTextReaderErrMemory(reader);
        }
      }
      break;
    case 3:
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,(xmlChar *)"#text");
      break;
    case 4:
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,(xmlChar *)"#cdata-section");
      break;
    case 5:
    case 6:
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,*(xmlChar **)(ret + 0x10));
      break;
    case 7:
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,*(xmlChar **)(ret + 0x10));
      break;
    case 8:
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,(xmlChar *)"#comment");
      break;
    case 9:
    case 0xd:
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,(xmlChar *)"#document");
      break;
    case 10:
    case 0xe:
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,*(xmlChar **)(ret + 0x10));
      break;
    case 0xb:
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,(xmlChar *)"#document-fragment");
      break;
    case 0xc:
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,*(xmlChar **)(ret + 0x10));
      break;
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x13:
    case 0x14:
      reader_local = (xmlTextReaderPtr)0x0;
      break;
    case 0x12:
      if (*(long *)(ret + 0x18) == 0) {
        reader_local = (xmlTextReaderPtr)readerStrdup(reader,"xmlns");
      }
      else {
        reader_local = (xmlTextReaderPtr)
                       xmlBuildQName(*(xmlChar **)(ret + 0x18),"xmlns",(xmlChar *)0x0,0);
        if (reader_local == (xmlTextReaderPtr)0x0) {
          xmlTextReaderErrMemory(reader);
        }
      }
      break;
    default:
      reader_local = (xmlTextReaderPtr)0x0;
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderName(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    xmlChar *ret;

    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    if ((node->ns == NULL) ||
		(node->ns->prefix == NULL))
		return(readerStrdup(reader, node->name));

            ret = xmlBuildQName(node->name, node->ns->prefix, NULL, 0);
            if (ret == NULL)
                xmlTextReaderErrMemory(reader);
	    return(ret);
        case XML_TEXT_NODE:
	    return(readerStrdup(reader, BAD_CAST "#text"));
        case XML_CDATA_SECTION_NODE:
	    return(readerStrdup(reader, BAD_CAST "#cdata-section"));
        case XML_ENTITY_NODE:
        case XML_ENTITY_REF_NODE:
	    return(readerStrdup(reader, node->name));
        case XML_PI_NODE:
	    return(readerStrdup(reader, node->name));
        case XML_COMMENT_NODE:
	    return(readerStrdup(reader, BAD_CAST "#comment"));
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    return(readerStrdup(reader, BAD_CAST "#document"));
        case XML_DOCUMENT_FRAG_NODE:
	    return(readerStrdup(reader, BAD_CAST "#document-fragment"));
        case XML_NOTATION_NODE:
	    return(readerStrdup(reader, node->name));
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DTD_NODE:
	    return(readerStrdup(reader, node->name));
        case XML_NAMESPACE_DECL: {
	    xmlNsPtr ns = (xmlNsPtr) node;

	    if (ns->prefix == NULL)
		return(readerStrdup(reader, BAD_CAST "xmlns"));
            ret = xmlBuildQName(ns->prefix, BAD_CAST "xmlns", NULL, 0);
            if (ret == NULL)
                xmlTextReaderErrMemory(reader);
	    return(ret);
	}

        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    return(NULL);
    }
    return(NULL);
}